

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O2

ps_endpointer_t *
ps_endpointer_init(double window,double ratio,ps_vad_mode_t mode,int sample_rate,double frame_length
                  )

{
  int iVar1;
  ps_endpointer_t *ep;
  ps_vad_t *vad;
  size_t sVar2;
  int16 *piVar3;
  int8 *piVar4;
  char *fmt;
  long ln;
  uint uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  uint uVar11;
  undefined8 in_XMM1_Qb;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined8 uVar15;
  
  ep = (ps_endpointer_t *)
       __ckd_calloc__(1,0x68,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                      ,0x3b);
  ep->refcount = 1;
  vad = ps_vad_init(mode,sample_rate,frame_length);
  ep->vad = vad;
  if (vad != (ps_vad_t *)0x0) {
    dVar14 = (double)(~-(ulong)(window == 0.0) & (ulong)window |
                     -(ulong)(window == 0.0) & 0x3fd3333333333333);
    uVar15 = 0;
    dVar12 = (double)(~-(ulong)(ratio == 0.0) & (ulong)ratio |
                     -(ulong)(ratio == 0.0) & 0x3feccccccccccccd);
    sVar2 = ps_vad_frame_size(vad);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    dVar7 = auVar6._8_8_ - 1.9342813113834067e+25;
    dVar9 = dVar7 + ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    iVar1 = ps_vad_sample_rate(ep->vad);
    dVar13 = dVar9 / (double)iVar1;
    dVar10 = dVar14 / dVar13 + 0.5;
    uVar5 = (uint)dVar10;
    ep->frame_length = dVar13;
    dVar10 = (double)(int)dVar10;
    uVar8 = (uint)(dVar12 * dVar10);
    uVar11 = (uint)((1.0 - dVar12) * dVar10 + 0.5);
    ep->maxlen = uVar5;
    ep->start_frames = uVar8;
    ep->end_frames = uVar11;
    if (((int)uVar8 < 1) || ((int)uVar5 <= (int)uVar8)) {
      fmt = "Ratio %.2f makes start-pointing stupid or impossible (%d frames of %d)\n";
      ln = 0x4a;
    }
    else {
      if ((0 < (int)uVar11) && ((int)uVar11 < (int)uVar5)) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                ,0x54,"Threshold %d%% of %.3fs window (>%d frames <%d frames of %d)\n",
                dVar13 * (double)(int)uVar5,(ulong)(uint)(int)(dVar12 * 100.0 + 0.5),(ulong)uVar8,
                uVar11,(ulong)uVar5);
        sVar2 = ps_vad_frame_size(ep->vad);
        ep->frame_size = (int)sVar2;
        piVar3 = (int16 *)__ckd_calloc__(2,(long)(int)sVar2 * (long)ep->maxlen,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                         ,0x57);
        ep->buf = piVar3;
        piVar4 = (int8 *)__ckd_calloc__(1,(long)ep->maxlen,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                                        ,0x58);
        ep->is_speech = piVar4;
        ep->pos = 0;
        ep->n = 0;
        return ep;
      }
      fmt = "Ratio %.2f makes end-pointing stupid or impossible (%d frames of %d)\n";
      ln = 0x4f;
      uVar8 = uVar11;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
            ,ln,fmt,(ulong)uVar8,(ulong)uVar5,dVar9,dVar7,dVar12,in_XMM1_Qb,dVar14,uVar15);
  }
  ps_endpointer_free(ep);
  return (ps_endpointer_t *)0x0;
}

Assistant:

ps_endpointer_t *
ps_endpointer_init(double window,
                   double ratio,
                   ps_vad_mode_t mode,
                   int sample_rate, double frame_length)
{
    ps_endpointer_t *ep = ckd_calloc(1, sizeof(*ep));
    ep->refcount = 1;
    if ((ep->vad = ps_vad_init(mode, sample_rate, frame_length)) == NULL)
        goto error_out;
    if (window == 0.0)
        window = PS_ENDPOINTER_DEFAULT_WINDOW;
    if (ratio == 0.0)
        ratio = PS_ENDPOINTER_DEFAULT_RATIO;
    ep->frame_length = ps_vad_frame_length(ep->vad);
    ep->maxlen = (int)(window / ep->frame_length + 0.5);
    ep->start_frames = (int)(ratio * ep->maxlen);
    ep->end_frames = (int)((1.0 - ratio) * ep->maxlen + 0.5);
    /* Make sure endpointing is possible ;-) */
    if (ep->start_frames <= 0 || ep->start_frames >= ep->maxlen) {
        E_ERROR("Ratio %.2f makes start-pointing stupid or impossible (%d frames of %d)\n",
                ratio, ep->start_frames, ep->maxlen);
        goto error_out;
    }
    if (ep->end_frames <= 0 || ep->end_frames >= ep->maxlen) {
        E_ERROR("Ratio %.2f makes end-pointing stupid or impossible (%d frames of %d)\n",
                ratio, ep->end_frames, ep->maxlen);
        goto error_out;
    }
    E_INFO("Threshold %d%% of %.3fs window (>%d frames <%d frames of %d)\n",
           (int)(ratio * 100.0 + 0.5),
           ep->maxlen * ep->frame_length, ep->start_frames, ep->end_frames, ep->maxlen);
    ep->frame_size = ps_endpointer_frame_size(ep);
    ep->buf = ckd_calloc(sizeof(*ep->buf),
                         ep->maxlen * ep->frame_size);
    ep->is_speech = ckd_calloc(1, ep->maxlen);
    ep->pos = ep->n = 0;
    return ep;
error_out:
    ps_endpointer_free(ep);
    return NULL;
}